

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindow*,QRect>
               (QWindow *args,QRect args_1)

{
  long lVar1;
  QRect args_1_00;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  GeometryChangeEvent *in_RDI;
  long in_FS_OFFSET;
  GeometryChangeEvent event;
  ProcessEventsFlag in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QWindow *in_stack_ffffffffffffff90;
  GeometryChangeEvent *in_stack_ffffffffffffff98;
  undefined1 local_60 [16];
  byte local_50;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QThread::isMainThread();
  if ((uVar4 & 1) == 0) {
    args_1_00._8_8_ = in_RDX;
    args_1_00._0_8_ = in_RSI;
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindow*,QRect>
              ((QWindow *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),args_1_00);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_RDI,in_stack_ffffffffffffff7c);
    bVar2 = QWindowSystemInterface::flushWindowSystemEvents
                      ((ProcessEventsFlags)in_stack_ffffffffffffffdc.i);
    goto LAB_0044a493;
  }
  memset(local_60,0xaa,0x48);
  QWindowSystemInterfacePrivate::GeometryChangeEvent::GeometryChangeEvent
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent
              (&in_stack_ffffffffffffff98->super_WindowSystemEvent);
LAB_0044a432:
    bVar2 = local_50 & 1;
  }
  else {
    uVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_60);
    if ((uVar3 & 1) != 0) goto LAB_0044a432;
    bVar2 = 0;
  }
  QWindowSystemInterfacePrivate::GeometryChangeEvent::~GeometryChangeEvent(in_RDI);
LAB_0044a493:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}